

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void shallue_van_de_woestijne(secp256k1_ge *ge,secp256k1_fe *t)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t mask0;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  secp256k1_fe y2;
  secp256k1_fe x3;
  secp256k1_fe x3d;
  secp256k1_fe y3;
  secp256k1_fe x2;
  secp256k1_fe jinv;
  secp256k1_fe wn;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  ulong local_2e8;
  secp256k1_fe local_2d8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  ulong local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  ulong local_268;
  secp256k1_fe local_260;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  ulong local_218;
  secp256k1_fe local_208;
  secp256k1_fe local_1d8;
  secp256k1_fe local_1a8;
  secp256k1_fe local_178;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_128;
  secp256k1_fe local_120;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_88;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  secp256k1_fe_mul(&local_58,&shallue_van_de_woestijne::c,t);
  secp256k1_fe_sqr(&local_260,t);
  uVar7 = local_260.n[0] + 8;
  local_260.n[0] = uVar7;
  secp256k1_fe_mul(&local_2d8,t,&local_58);
  uVar6 = 0x3fffffffffffc - local_2d8.n[4];
  local_2d8.n[4] = uVar6;
  secp256k1_fe_mul(&local_178,&shallue_van_de_woestijne::d,&local_260);
  local_2d8.n[0] = 0x3ffffbfffff0bc - local_2d8.n[0];
  local_2d8.n[1] = 0x3ffffffffffffc - local_2d8.n[1];
  local_178.n[0] = local_2d8.n[0] + local_178.n[0];
  local_178.n[1] = local_2d8.n[1] + local_178.n[1];
  local_2d8.n[2] = 0x3ffffffffffffc - local_2d8.n[2];
  local_2d8.n[3] = 0x3ffffffffffffc - local_2d8.n[3];
  local_178.n[2] = local_2d8.n[2] + local_178.n[2];
  local_178.n[3] = local_2d8.n[3] + local_178.n[3];
  local_178.n[4] = uVar6 + local_178.n[4];
  local_1a8.n[0] = 0xbffff3ffffd234 - (uVar7 + local_178.n[0]);
  local_1a8.n[1] = 0xbffffffffffff4 - (local_178.n[1] + local_260.n[1]);
  local_1a8.n[2] = 0xbffffffffffff4 - (local_178.n[2] + local_260.n[2]);
  local_1a8.n[3] = 0xbffffffffffff4 - (local_178.n[3] + local_260.n[3]);
  local_1a8.n[4] = 0xbfffffffffff4 - (local_178.n[4] + local_260.n[4]);
  secp256k1_fe_mul(&local_208,&shallue_van_de_woestijne::c,t);
  secp256k1_fe_sqr(&local_208,&local_208);
  secp256k1_fe_sqr(&local_1d8,&local_260);
  local_1d8.n[0] = local_1d8.n[0] + local_208.n[0];
  local_1d8.n[1] = local_1d8.n[1] + local_208.n[1];
  local_1d8.n[2] = local_1d8.n[2] + local_208.n[2];
  local_1d8.n[3] = local_1d8.n[3] + local_208.n[3];
  local_1d8.n[4] = local_1d8.n[4] + local_208.n[4];
  secp256k1_fe_mul(&local_80,&local_208,&local_260);
  secp256k1_fe_inv(&local_80,&local_80);
  secp256k1_fe_mul((secp256k1_fe *)local_308,&local_178,&local_208);
  secp256k1_fe_mul((secp256k1_fe *)local_308,(secp256k1_fe *)local_308,&local_80);
  secp256k1_fe_mul((secp256k1_fe *)local_a8,&local_1a8,&local_208);
  secp256k1_fe_mul((secp256k1_fe *)local_a8,(secp256k1_fe *)local_a8,&local_80);
  secp256k1_fe_mul((secp256k1_fe *)local_288,&local_1d8,&local_260);
  secp256k1_fe_mul((secp256k1_fe *)local_288,(secp256k1_fe *)local_288,&local_80);
  secp256k1_fe_sqr(&local_d0,(secp256k1_fe *)local_308);
  secp256k1_fe_mul(&local_d0,&local_d0,(secp256k1_fe *)local_308);
  local_d0.n[0] = local_d0.n[0] + 7;
  secp256k1_fe_sqr(&local_f8,(secp256k1_fe *)local_a8);
  secp256k1_fe_mul(&local_f8,&local_f8,(secp256k1_fe *)local_a8);
  local_f8.n[0] = local_f8.n[0] + 7;
  secp256k1_fe_sqr(&local_120,(secp256k1_fe *)local_288);
  secp256k1_fe_mul(&local_120,&local_120,(secp256k1_fe *)local_288);
  local_120.n[0] = local_120.n[0] + 7;
  uVar2 = secp256k1_fe_sqrt((secp256k1_fe *)local_238,&local_d0);
  uVar3 = secp256k1_fe_sqrt((secp256k1_fe *)local_2b0,&local_f8);
  secp256k1_fe_sqrt((secp256k1_fe *)local_148,&local_120);
  uVar5 = (ulong)((uVar2 ^ 1) & uVar3);
  uVar1 = uVar5 - 1;
  uVar5 = -uVar5;
  uVar8 = (ulong)(~uVar3 & (uVar2 ^ 1));
  uVar4 = uVar8 - 1;
  uVar8 = -uVar8;
  auVar15._8_4_ = (int)uVar1;
  auVar15._0_8_ = uVar1;
  auVar15._12_4_ = (int)(uVar1 >> 0x20);
  auVar10._8_4_ = (int)uVar5;
  auVar10._0_8_ = uVar5;
  auVar10._12_4_ = (int)(uVar5 >> 0x20);
  auVar11._8_4_ = (int)uVar4;
  auVar11._0_8_ = uVar4;
  auVar11._12_4_ = (int)(uVar4 >> 0x20);
  auVar12._8_4_ = (int)uVar8;
  auVar12._0_8_ = uVar8;
  auVar12._12_4_ = (int)(uVar8 >> 0x20);
  auVar16 = local_288 & auVar12 | (local_a8 & auVar10 | local_308 & auVar15) & auVar11;
  auVar14 = local_278 & auVar12 | (local_98 & auVar10 | local_2f8 & auVar15) & auVar11;
  uVar9 = uVar8 & local_128 | (local_290 & uVar5 | uVar1 & local_218) & uVar4;
  auVar17 = local_138 & auVar12 | (local_2a0 & auVar10 | auVar15 & local_228) & auVar11;
  auVar15 = local_148 & auVar12 | (local_2b0 & auVar10 | local_238 & auVar15) & auVar11;
  ge->infinity = 0;
  (ge->x).n[4] = local_268 & uVar8 | (local_88 & uVar5 | local_2e8 & uVar1) & uVar4;
  local_308._0_8_ = auVar16._0_8_;
  local_308._8_8_ = auVar16._8_8_;
  local_2f8._0_8_ = auVar14._0_8_;
  local_2f8._8_8_ = auVar14._8_8_;
  (ge->x).n[2] = local_2f8._0_8_;
  (ge->x).n[3] = local_2f8._8_8_;
  (ge->x).n[0] = local_308._0_8_;
  (ge->x).n[1] = local_308._8_8_;
  (ge->y).n[4] = uVar9;
  local_238._0_8_ = auVar15._0_8_;
  local_238._8_8_ = auVar15._8_8_;
  local_228._0_8_ = auVar17._0_8_;
  local_228._8_8_ = auVar17._8_8_;
  (ge->y).n[2] = local_228._0_8_;
  (ge->y).n[3] = local_228._8_8_;
  (ge->y).n[0] = local_238._0_8_;
  (ge->y).n[1] = local_238._8_8_;
  uVar4 = (ulong)((uint)t->n[0] & 1);
  auVar15 = *(undefined1 (*) [16])(ge->y).n;
  auVar10 = *(undefined1 (*) [16])((ge->y).n + 2);
  auVar13._0_8_ = 0x3ffffffffffffc - auVar10._0_8_;
  auVar13._8_8_ = 0x3ffffffffffffc - auVar10._8_8_;
  auVar17._0_8_ = 0x3ffffbfffff0bc - auVar15._0_8_;
  auVar17._8_8_ = 0x3ffffffffffffc - auVar15._8_8_;
  uVar1 = uVar4 - 1;
  uVar4 = -uVar4;
  auVar16._8_4_ = (int)uVar1;
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = (int)(uVar1 >> 0x20);
  auVar14._8_4_ = (int)uVar4;
  auVar14._0_8_ = uVar4;
  auVar14._12_4_ = (int)(uVar4 >> 0x20);
  *(undefined1 (*) [16])((ge->y).n + 2) = auVar13 & auVar14 | auVar10 & auVar16;
  *(undefined1 (*) [16])(ge->y).n = auVar17 & auVar14 | auVar16 & auVar15;
  (ge->y).n[4] = uVar4 & 0x3fffffffffffc - uVar9 | uVar1 & uVar9;
  return;
}

Assistant:

static void shallue_van_de_woestijne(secp256k1_ge* ge, const secp256k1_fe* t) {
    /* Implements the algorithm from:
     *    Indifferentiable Hashing to Barreto-Naehrig Curves
     *    Pierre-Alain Fouque and Mehdi Tibouchi
     *    Latincrypt 2012
     */

    /* Basic algorithm:

       c = sqrt(-3)
       d = (c - 1)/2

       w = c * t / (1 + b + t^2)  [with b = 7]
       x1 = d - t*w
       x2 = -(x1 + 1)
       x3 = 1 + 1/w^2

       To avoid the 2 divisions, compute the above in numerator/denominator form:
       wn = c * t
       wd = 1 + 7 + t^2
       x1n = d*wd - t*wn
       x1d = wd
       x2n = -(x1n + wd)
       x2d = wd
       x3n = wd^2 + c^2 + t^2
       x3d = (c * t)^2

       The joint denominator j = wd * c^2 * t^2, and
       1 / x1d = 1/j * c^2 * t^2
       1 / x2d = x3d = 1/j * wd
    */

    static const secp256k1_fe c = SECP256K1_FE_CONST(0x0a2d2ba9, 0x3507f1df, 0x233770c2, 0xa797962c, 0xc61f6d15, 0xda14ecd4, 0x7d8d27ae, 0x1cd5f852);
    static const secp256k1_fe d = SECP256K1_FE_CONST(0x851695d4, 0x9a83f8ef, 0x919bb861, 0x53cbcb16, 0x630fb68a, 0xed0a766a, 0x3ec693d6, 0x8e6afa40);
    static const secp256k1_fe b = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 7);
    static const secp256k1_fe b_plus_one = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 8);

    secp256k1_fe wn, wd, x1n, x2n, x3n, x3d, jinv, tmp, x1, x2, x3, alphain, betain, gammain, y1, y2, y3;
    int alphaquad, betaquad;

    secp256k1_fe_mul(&wn, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&wd, t); /* mag 1 */
    secp256k1_fe_add(&wd, &b_plus_one); /* mag 2 */
    secp256k1_fe_mul(&tmp, t, &wn); /* mag 1 */
    secp256k1_fe_negate(&tmp, &tmp, 1); /* mag 2 */
    secp256k1_fe_mul(&x1n, &d, &wd); /* mag 1 */
    secp256k1_fe_add(&x1n, &tmp); /* mag 3 */
    x2n = x1n; /* mag 3 */
    secp256k1_fe_add(&x2n, &wd); /* mag 5 */
    secp256k1_fe_negate(&x2n, &x2n, 5); /* mag 6 */
    secp256k1_fe_mul(&x3d, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&x3d, &x3d); /* mag 1 */
    secp256k1_fe_sqr(&x3n, &wd); /* mag 1 */
    secp256k1_fe_add(&x3n, &x3d); /* mag 2 */
    secp256k1_fe_mul(&jinv, &x3d, &wd); /* mag 1 */
    secp256k1_fe_inv(&jinv, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3n, &wd); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3, &jinv); /* mag 1 */

    secp256k1_fe_sqr(&alphain, &x1); /* mag 1 */
    secp256k1_fe_mul(&alphain, &alphain, &x1); /* mag 1 */
    secp256k1_fe_add(&alphain, &b); /* mag 2 */
    secp256k1_fe_sqr(&betain, &x2); /* mag 1 */
    secp256k1_fe_mul(&betain, &betain, &x2); /* mag 1 */
    secp256k1_fe_add(&betain, &b); /* mag 2 */
    secp256k1_fe_sqr(&gammain, &x3); /* mag 1 */
    secp256k1_fe_mul(&gammain, &gammain, &x3); /* mag 1 */
    secp256k1_fe_add(&gammain, &b); /* mag 2 */

    alphaquad = secp256k1_fe_sqrt(&y1, &alphain);
    betaquad = secp256k1_fe_sqrt(&y2, &betain);
    secp256k1_fe_sqrt(&y3, &gammain);

    secp256k1_fe_cmov(&x1, &x2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&y1, &y2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&x1, &x3, (!alphaquad) & !betaquad);
    secp256k1_fe_cmov(&y1, &y3, (!alphaquad) & !betaquad);

    secp256k1_ge_set_xy(ge, &x1, &y1);

    /* The linked algorithm from the paper uses the Jacobi symbol of t to
     * determine the Jacobi symbol of the produced y coordinate. Since the
     * rest of the algorithm only uses t^2, we can safely use another criterion
     * as long as negation of t results in negation of the y coordinate. Here
     * we choose to use t's oddness, as it is faster to determine. */
    secp256k1_fe_negate(&tmp, &ge->y, 1);
    secp256k1_fe_cmov(&ge->y, &tmp, secp256k1_fe_is_odd(t));
}